

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fphdlimp.cpp
# Opt level: O3

void __thiscall
icu_63::FieldPositionIteratorHandler::addAttribute
          (FieldPositionIteratorHandler *this,int32_t id,int32_t start,int32_t limit)

{
  UErrorCode *status;
  int newSize;
  int iVar1;
  UVector32 *pUVar2;
  UBool UVar3;
  int32_t iVar4;
  int iVar5;
  
  if (this->iter == (FieldPositionIterator *)0x0) {
    return;
  }
  if (limit <= start) {
    return;
  }
  if (U_ZERO_ERROR < this->status) {
    return;
  }
  status = &this->status;
  pUVar2 = this->vec;
  newSize = pUVar2->count;
  if ((newSize < -1) || (iVar4 = newSize, pUVar2->capacity <= newSize)) {
    UVar3 = UVector32::expandCapacity(pUVar2,newSize + 1,status);
    if (UVar3 != '\0') {
      iVar4 = pUVar2->count;
      goto LAB_00251940;
    }
  }
  else {
LAB_00251940:
    pUVar2->elements[iVar4] = id;
    pUVar2->count = pUVar2->count + 1;
  }
  pUVar2 = this->vec;
  iVar1 = (this->super_FieldPositionHandler).fShift;
  iVar4 = pUVar2->count;
  if ((iVar4 < -1) || (pUVar2->capacity <= iVar4)) {
    UVar3 = UVector32::expandCapacity(pUVar2,iVar4 + 1,status);
    if (UVar3 != '\0') {
      iVar4 = pUVar2->count;
      goto LAB_00251984;
    }
  }
  else {
LAB_00251984:
    pUVar2->elements[iVar4] = start + iVar1;
    pUVar2->count = pUVar2->count + 1;
  }
  pUVar2 = this->vec;
  iVar1 = (this->super_FieldPositionHandler).fShift;
  iVar5 = pUVar2->count;
  if ((iVar5 < -1) || (pUVar2->capacity <= iVar5)) {
    UVar3 = UVector32::expandCapacity(pUVar2,iVar5 + 1,status);
    if (UVar3 == '\0') goto LAB_002519d1;
    iVar5 = pUVar2->count;
  }
  pUVar2->elements[iVar5] = limit + iVar1;
  pUVar2->count = pUVar2->count + 1;
LAB_002519d1:
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  UVector32::setSize(this->vec,newSize);
  return;
}

Assistant:

void
FieldPositionIteratorHandler::addAttribute(int32_t id, int32_t start, int32_t limit) {
  if (iter && U_SUCCESS(status) && start < limit) {
    int32_t size = vec->size();
    vec->addElement(id, status);
    vec->addElement(start + fShift, status);
    vec->addElement(limit + fShift, status);
    if (!U_SUCCESS(status)) {
      vec->setSize(size);
    }
  }
}